

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::Return(SQVM *this,SQInteger _arg0,SQInteger _arg1,SQObjectPtr *retval)

{
  int iVar1;
  SQBool SVar2;
  long lVar3;
  CallInfo *pCVar4;
  SQInteger i;
  long lVar5;
  
  pCVar4 = this->ci;
  SVar2 = pCVar4->_root;
  lVar3 = this->_stackbase;
  iVar1 = pCVar4->_prevstkbase;
  if (this->_debughook == true) {
    for (lVar5 = 0; lVar5 < pCVar4->_ncalls; lVar5 = lVar5 + 1) {
      CallDebugHook(this,0x72,0);
      pCVar4 = this->ci;
    }
  }
  if ((SVar2 != 0) ||
     (((long)pCVar4->_target != -1 &&
      (retval = (this->_stack)._vals + (lVar3 - iVar1) + (long)pCVar4->_target,
      retval != (SQObjectPtr *)0x0)))) {
    if (_arg0 == 0xff) {
      SQObjectPtr::Null(retval);
    }
    else {
      SQObjectPtr::operator=(retval,(this->_stack)._vals + this->_stackbase + _arg1);
    }
  }
  LeaveFrame(this);
  return SVar2 != 0;
}

Assistant:

bool SQVM::Return(SQInteger _arg0, SQInteger _arg1, SQObjectPtr &retval)
{
    SQBool    _isroot      = ci->_root;
    SQInteger callerbase   = _stackbase - ci->_prevstkbase;

    if (_debughook) {
        for(SQInteger i=0; i<ci->_ncalls; i++) {
            CallDebugHook(_SC('r'));
        }
    }

    SQObjectPtr *dest;
    if (_isroot) {
        dest = &(retval);
    } else if (ci->_target == -1) {
        dest = NULL;
    } else {
        dest = &_stack._vals[callerbase + ci->_target];
    }
    if (dest) {
        if(_arg0 != 0xFF) {
            *dest = _stack._vals[_stackbase+_arg1];
        }
        else {
            dest->Null();
        }
        //*dest = (_arg0 != 0xFF) ? _stack._vals[_stackbase+_arg1] : _null_;
    }
    LeaveFrame();
    return _isroot ? true : false;
}